

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O3

void __thiscall test_app::upperA::~upperA(upperA *this)

{
  cppcms::util::filterbuf<test_app::upperA,_16>::~filterbuf
            (&this->super_filterbuf<test_app::upperA,_16>);
  operator_delete(this);
  return;
}

Assistant:

int convert(char const *begin,char const *end,std::streambuf *out)
		{
			while(begin!=end) {
				char c=*begin++;
				if('a'<=c && c<='z')
					c = 'A' + (c-'a');
				if(out->sputc(c)==EOF)
					return -1;
			}
			return 0;
		}